

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkService
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  long lVar1;
  ServiceOptions *pSVar2;
  Type *proto_00;
  long lVar3;
  int i;
  long lVar4;
  
  if (*(long *)(service + 0x18) == 0) {
    pSVar2 = ServiceOptions::default_instance();
    *(ServiceOptions **)(service + 0x18) = pSVar2;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(service + 0x20); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(service + 0x28);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                         (&(proto->method_).super_RepeatedPtrFieldBase,(int)lVar4);
    CrossLinkMethod(this,(MethodDescriptor *)(lVar1 + lVar3),proto_00);
    lVar3 = lVar3 + 0x30;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkService(
    ServiceDescriptor* service, const ServiceDescriptorProto& proto) {
  if (service->options_ == NULL) {
    service->options_ = &ServiceOptions::default_instance();
  }

  for (int i = 0; i < service->method_count(); i++) {
    CrossLinkMethod(&service->methods_[i], proto.method(i));
  }
}